

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

IStreamingReporterPtr __thiscall
Catch::anon_unknown_1::createReporter(anon_unknown_1 *this,string *reporterName,IConfigPtr *config)

{
  _Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
  _Var1;
  int iVar2;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar3;
  undefined4 extraout_var;
  pointer *__ptr;
  long in_FS_OFFSET;
  ReusableStringStream RStack_58;
  string local_40;
  __uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
  local_20;
  
  local_20._M_t.
  super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
  .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
       *(tuple<Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_> *)
        (in_FS_OFFSET + 0x28);
  pSVar3 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar2 = (*(pSVar3->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar3);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
            (this,(long *)CONCAT44(extraout_var,iVar2),reporterName,config);
  if (*(long *)this == 0) {
    ReusableStringStream::ReusableStringStream(&RStack_58);
    std::__ostream_insert<char,std::char_traits<char>>
              (RStack_58.m_oss,"No reporter registered with name: \'",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              (RStack_58.m_oss,(reporterName->_M_dataplus)._M_p,reporterName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(RStack_58.m_oss,"\'",1);
    std::__cxx11::stringbuf::str();
    if ((tuple<Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>)
        *(IStreamingReporter **)(in_FS_OFFSET + 0x28) ==
        (_Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
         )local_20._M_t.
          super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
          .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl) {
      throw_domain_error(&local_40);
    }
  }
  else {
    _Var1.super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
         ((_Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           *)(in_FS_OFFSET + 0x28))->super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>;
    if (_Var1.super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl ==
        (_Head_base<0UL,_Catch::IStreamingReporter_*,_false>)
        local_20._M_t.
        super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
        .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl) {
      return (__uniq_ptr_data<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>,_true,_true>
              )(tuple<Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>)
               _Var1.super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
    }
  }
  __stack_chk_fail();
}

Assistant:

IStreamingReporterPtr createReporter(std::string const& reporterName, IConfigPtr const& config) {
            auto reporter = Catch::getRegistryHub().getReporterRegistry().create(reporterName, config);
            CATCH_ENFORCE(reporter, "No reporter registered with name: '" << reporterName << "'");

            return reporter;
        }